

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O1

double SimpleBVH::anon_unknown_6::point_box_signed_squared_distance
                 (VectorMax3d *p,array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *B)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  if ((p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows !=
      B->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows)
  {
    __assert_fail("p.size() == B[0].size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                  ,0x9f,
                  "double SimpleBVH::(anonymous namespace)::point_box_signed_squared_distance(const VectorMax3d &, const std::array<VectorMax3d, 2> &)"
                 );
  }
  lVar1 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows;
  if (lVar1 < 1) {
    dVar8 = 0.0;
    bVar6 = true;
  }
  else {
    lVar2 = B->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
            m_rows;
    lVar4 = 0;
    if (lVar2 < 1) {
      lVar2 = lVar4;
    }
    bVar6 = true;
    dVar8 = 0.0;
    do {
      if (lVar2 == lVar4) goto LAB_00119908;
      dVar9 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_data.
              array[lVar4];
      dVar10 = B->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
               m_storage.m_data.array[lVar4];
      if (dVar9 < dVar10) {
LAB_001197f9:
        dVar8 = dVar8 + (dVar9 - dVar10) * (dVar9 - dVar10);
        bVar6 = false;
      }
      else {
        if (B->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
            m_rows <= lVar4) goto LAB_00119908;
        dVar10 = B->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[lVar4];
        if (dVar10 < dVar9) goto LAB_001197f9;
      }
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
  if (bVar6) {
    lVar2 = B->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
            m_rows;
    if (lVar1 != lVar2) {
      __assert_fail("p.size() == B[0].size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                    ,0x91,
                    "double SimpleBVH::(anonymous namespace)::inner_point_box_squared_distance(const VectorMax3d &, const std::array<VectorMax3d, 2> &)"
                   );
    }
    if (((lVar1 < 1) || (lVar2 < 1)) ||
       (lVar4 = B->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                m_storage.m_rows, lVar4 < 1)) {
LAB_00119908:
      __assert_fail("index >= 0 && index < size()",
                    "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/DenseCoeffsBase.h"
                    ,0xa3,
                    "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1, 0, 3, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1, 0, 3, 1>, Level = 0]"
                   );
    }
    dVar8 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_data.
            array[0];
    dVar9 = dVar8 - B->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[0];
    dVar8 = dVar8 - B->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[0];
    dVar9 = dVar9 * dVar9;
    dVar8 = dVar8 * dVar8;
    if (dVar9 <= dVar8) {
      dVar8 = dVar9;
    }
    if (lVar1 != 1) {
      if (lVar2 < 2) {
        lVar2 = 1;
      }
      if (lVar4 < 2) {
        lVar4 = 1;
      }
      uVar3 = lVar4 - 1;
      uVar7 = lVar1 - 2U;
      if (uVar3 < lVar1 - 2U) {
        uVar7 = uVar3;
      }
      lVar4 = 1;
      if (1 < lVar1) {
        lVar4 = lVar1;
      }
      uVar5 = lVar4 - 1;
      if (uVar5 <= uVar7) {
        uVar7 = uVar5;
      }
      if (((lVar2 - 1U <= uVar7) || (uVar5 == uVar7)) || (uVar3 == uVar7)) goto LAB_00119908;
      lVar2 = 0;
      do {
        dVar9 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_data.
                array[lVar2 + 1];
        dVar10 = dVar9 - B->_M_elems[0].
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                         m_data.array[lVar2 + 1];
        dVar10 = dVar10 * dVar10;
        if (dVar8 <= dVar10) {
          dVar10 = dVar8;
        }
        dVar9 = dVar9 - B->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                        .m_storage.m_data.array[lVar2 + 1];
        dVar8 = dVar9 * dVar9;
        if (dVar10 <= dVar8) {
          dVar8 = dVar10;
        }
        lVar2 = lVar2 + 1;
      } while (lVar1 + -1 != lVar2);
    }
    dVar8 = -dVar8;
  }
  return dVar8;
}

Assistant:

double point_box_signed_squared_distance(
        const VectorMax3d& p, const std::array<VectorMax3d, 2>& B)
    {
        assert(p.size() == B[0].size());

        bool inside = true;
        double result = 0.0;
        for (int c = 0; c < p.size(); c++) {
            if (p[c] < B[0][c]) {
                inside = false;
                result += std::pow(p[c] - B[0][c], 2);
            } else if (p[c] > B[1][c]) {
                inside = false;
                result += std::pow(p[c] - B[1][c], 2);
            }
        }
        if (inside) {
            result = -inner_point_box_squared_distance(p, B);
        }
        return result;
    }